

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O1

shared_ptr<MyCompiler::Term> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Term>(RecursiveDescentParser *this)

{
  istream *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar2 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  long lVar5;
  SyntaxError *pSVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  long in_RSI;
  char *pcVar8;
  Number *this_01;
  shared_ptr<MyCompiler::Factor> sVar9;
  shared_ptr<MyCompiler::Term> sVar10;
  shared_ptr<MyCompiler::Factor> p2;
  shared_ptr<MyCompiler::MulDivOp> p1;
  undefined1 local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  istream local_68 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  istream *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Term,std::allocator<MyCompiler::Term>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Term **)this,
             (allocator<MyCompiler::Term> *)local_78);
  sVar9 = parse<MyCompiler::Factor>((RecursiveDescentParser *)local_78);
  p_Var3 = p_Stack_70;
  auVar2 = local_78;
  _Var7 = sVar9.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  piVar1 = this->stream;
  local_78 = (undefined1  [8])0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50);
  *(undefined1 (*) [8])(piVar1 + 0x48) = auVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50) = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var7._M_pi = extraout_RDX;
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (*(int *)(in_RSI + 0x30) - 5U < 2) {
    do {
      parse<MyCompiler::MulDivOp>((RecursiveDescentParser *)&local_40);
      parse<MyCompiler::Factor>((RecursiveDescentParser *)(local_68 + 0x18));
      piVar1 = this->stream;
      if (((*(int *)(*(long *)(piVar1 + 0x48) + 4) == 1) && (*(int *)(local_68._24_8_ + 4) == 1)) &&
         (*(long *)(piVar1 + 0x58) == *(long *)(piVar1 + 0x60))) {
        iVar4 = std::__cxx11::string::compare((char *)(local_40 + 0x28));
        if (iVar4 == 0) {
          this_01 = *(Number **)(*(long *)(this->stream + 0x48) + 0x58);
          lVar5 = ((((shared_ptr<MyCompiler::Number> *)(local_68._24_8_ + 0x58))->
                   super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->num
                  * this_01->num;
        }
        else {
          lVar5 = ((((shared_ptr<MyCompiler::Number> *)(local_68._24_8_ + 0x58))->
                   super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->num;
          if (lVar5 == 0) {
            pSVar6 = (SyntaxError *)__cxa_allocate_exception(0x10);
            local_78 = (undefined1  [8])local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_78,"attempt to division by zero","");
            SyntaxError::SyntaxError(pSVar6,(string *)local_78);
            __cxa_throw(pSVar6,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
          }
          this_01 = *(Number **)(*(long *)(this->stream + 0x48) + 0x58);
          lVar5 = this_01->num / lVar5;
        }
        Number::setNum(this_01,lVar5);
        lVar5 = *(long *)(*(long *)(*(long *)(this->stream + 0x48) + 0x58) + 0x48);
        _Var7._M_pi = extraout_RDX_04;
        if ((int)lVar5 != lVar5) {
          pSVar6 = (SyntaxError *)__cxa_allocate_exception(0x10);
          iVar4 = std::__cxx11::string::compare((char *)(local_40 + 0x28));
          pcVar8 = "attempt to divide with overflow";
          if (iVar4 == 0) {
            pcVar8 = "attempt to multiply with overflow";
          }
          local_78 = (undefined1  [8])local_68;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_78,pcVar8,pcVar8 + (ulong)(iVar4 == 0) * 2 + 0x1f);
          SyntaxError::SyntaxError(pSVar6,(string *)local_78);
          __cxa_throw(pSVar6,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        std::
        vector<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>,std::allocator<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>>>
        ::emplace_back<MyCompiler::MulDivOp&,MyCompiler::Factor&>
                  ((vector<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>,std::allocator<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>>>
                    *)(piVar1 + 0x58),(MulDivOp *)local_40,(Factor *)local_68._24_8_);
        _Var7._M_pi = extraout_RDX_01;
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        _Var7._M_pi = extraout_RDX_02;
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        _Var7._M_pi = extraout_RDX_03;
      }
    } while (*(int *)(in_RSI + 0x30) - 5U < 2);
  }
  sVar10.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar10.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Term>)
         sVar10.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Term> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Term>();

    pResult->pFactor = parse<Factor>();
    while (sym == SymbolType::TIMES || sym == SymbolType::SLASH)
    {
        auto p1 = parse<MulDivOp>();
        auto p2 = parse<Factor>();
        if (pResult->pFactor->caseNum == 1 && p2->caseNum == 1 && pResult->vMulDivOpFactor.empty())
        {
            if (p1->value == "*")
                pResult->pFactor->pNumber->setNum(pResult->pFactor->pNumber->num * p2->pNumber->num);
            else if (p2->pNumber->num != 0)
                pResult->pFactor->pNumber->setNum(pResult->pFactor->pNumber->num / p2->pNumber->num);
            else
                throw SyntaxError("attempt to division by zero");
            if (pResult->pFactor->pNumber->num > std::numeric_limits<int32_t>::max()
                || pResult->pFactor->pNumber->num < std::numeric_limits<int32_t>::min())
                throw SyntaxError(
                        p1->value == "*" ? "attempt to multiply with overflow" : "attempt to divide with overflow");
        }
        else
            pResult->vMulDivOpFactor.emplace_back(*p1, *p2);
    }

    return pResult;
}